

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPizCompressor.cpp
# Opt level: O3

int __thiscall
Imf_2_5::PizCompressor::compress
          (PizCompressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  long *plVar1;
  size_t __n;
  unsigned_short uVar2;
  unsigned_short *puVar3;
  int b;
  short sVar4;
  int k;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  const_iterator cVar11;
  const_iterator cVar12;
  ConstIterator CVar13;
  byte *__s;
  void *__s_00;
  short sVar14;
  ulong uVar15;
  uint b_00;
  char *compressed;
  byte bVar16;
  ulong uVar17;
  unsigned_short *puVar18;
  char *pcVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  int i_1;
  uint uVar23;
  long lVar24;
  ChannelData *pCVar25;
  bool bVar26;
  ulong local_68;
  char local_40 [4];
  int local_3c;
  char **local_38;
  
  if (inSize == 0) {
    *outPtr = this->_outBuffer;
    iVar8 = 0;
  }
  else {
    iVar8 = (range->min).x;
    uVar23 = (range->min).y;
    iVar5 = (range->max).x;
    uVar10 = (range->max).y;
    b_00 = this->_maxY;
    if ((int)uVar10 < this->_maxY) {
      b_00 = uVar10;
    }
    b = this->_maxX;
    if (iVar5 < this->_maxX) {
      b = iVar5;
    }
    puVar18 = this->_tmpBuffer;
    local_38 = outPtr;
    cVar11._M_node = (_Base_ptr)ChannelList::begin(this->_channels);
    cVar12._M_node = (_Base_ptr)ChannelList::end(this->_channels);
    if (cVar11._M_node != cVar12._M_node) {
      lVar24 = 0x1c;
      do {
        pCVar25 = this->_channelData;
        *(unsigned_short **)((long)pCVar25 + lVar24 + -0x1c) = puVar18;
        *(unsigned_short **)((long)pCVar25 + lVar24 + -0x14) = puVar18;
        iVar5 = numSamples(*(int *)&cVar11._M_node[9].field_0x4,iVar8,b);
        *(int *)((long)pCVar25 + lVar24 + -0xc) = iVar5;
        iVar5 = numSamples(*(int *)&cVar11._M_node[9]._M_parent,uVar23,b_00);
        *(int *)((long)pCVar25 + lVar24 + -8) = iVar5;
        *(undefined4 *)((long)pCVar25 + lVar24 + -4) = *(undefined4 *)&cVar11._M_node[9]._M_parent;
        iVar5 = pixelTypeSize(cVar11._M_node[9]._M_color);
        iVar6 = pixelTypeSize(HALF);
        *(int *)((long)&pCVar25->start + lVar24) = iVar5 / iVar6;
        puVar18 = puVar18 + (iVar5 / iVar6) * *(int *)((long)pCVar25 + lVar24 + -0xc) *
                            *(int *)((long)pCVar25 + lVar24 + -8);
        cVar11._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar11._M_node);
        CVar13 = ChannelList::end(this->_channels);
        lVar24 = lVar24 + 0x20;
      } while ((const_iterator)cVar11._M_node != CVar13._i._M_node);
    }
    if (this->_format == XDR) {
      if ((int)uVar23 <= (int)b_00) {
        uVar10 = this->_numChans;
        pCVar25 = this->_channelData;
        do {
          if (0 < (int)uVar10) {
            uVar20 = 0;
            do {
              uVar9 = pCVar25[uVar20].ys;
              if ((int)uVar23 < 0) {
                if (-1 < (int)uVar9) {
                  uVar7 = (uVar9 + ~uVar23) / uVar9;
                  goto LAB_0049d43f;
                }
                uVar7 = (~uVar9 - uVar23) / -uVar9;
              }
              else if ((int)uVar9 < 0) {
                uVar7 = uVar23 / -uVar9;
LAB_0049d43f:
                uVar7 = -uVar7;
              }
              else {
                uVar7 = uVar23 / uVar9;
              }
              if (uVar23 == uVar7 * uVar9) {
                iVar8 = pCVar25[uVar20].size * pCVar25[uVar20].nx;
                if (0 < iVar8) {
                  uVar9 = iVar8 + 1;
                  puVar3 = pCVar25[uVar20].end;
                  do {
                    uVar2 = *(unsigned_short *)inPtr;
                    inPtr = (char *)((long)inPtr + 2);
                    *puVar3 = uVar2;
                    pCVar25[uVar20].end = puVar3 + 1;
                    uVar9 = uVar9 - 1;
                    puVar3 = puVar3 + 1;
                  } while (1 < uVar9);
                }
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 != uVar10);
          }
          bVar26 = uVar23 != b_00;
          uVar23 = uVar23 + 1;
        } while (bVar26);
      }
    }
    else if ((int)uVar23 <= (int)b_00) {
      iVar8 = this->_numChans;
      do {
        if (0 < iVar8) {
          lVar21 = 8;
          lVar24 = 0;
          do {
            pCVar25 = this->_channelData;
            uVar10 = *(uint *)((long)&pCVar25->nx + lVar21);
            if ((int)uVar23 < 0) {
              if (-1 < (int)uVar10) {
                uVar9 = (~uVar23 + uVar10) / uVar10;
                goto LAB_0049d52c;
              }
              uVar9 = (~uVar10 - uVar23) / -uVar10;
            }
            else if ((int)uVar10 < 0) {
              uVar9 = uVar23 / -uVar10;
LAB_0049d52c:
              uVar9 = -uVar9;
            }
            else {
              uVar9 = uVar23 / uVar10;
            }
            if (uVar23 == uVar9 * uVar10) {
              lVar22 = (long)*(int *)((long)&pCVar25->ny + lVar21) *
                       (long)*(int *)((long)&pCVar25->end + lVar21);
              __n = lVar22 * 2;
              memcpy(*(void **)((long)&pCVar25->start + lVar21),inPtr,__n);
              inPtr = inPtr + lVar22 * 2;
              plVar1 = (long *)((long)&pCVar25->start + lVar21);
              *plVar1 = *plVar1 + __n;
              iVar8 = this->_numChans;
            }
            lVar24 = lVar24 + 1;
            lVar21 = lVar21 + 0x20;
          } while (lVar24 < iVar8);
        }
        bVar26 = uVar23 != b_00;
        uVar23 = uVar23 + 1;
      } while (bVar26);
    }
    __s = (byte *)operator_new__(0x2000);
    puVar3 = this->_tmpBuffer;
    bVar16 = 0;
    memset(__s,0,0x2000);
    uVar23 = (uint)((ulong)((long)puVar18 - (long)puVar3) >> 1);
    if (0 < (int)uVar23) {
      uVar20 = 0;
      do {
        __s[puVar3[uVar20] >> 3] =
             __s[puVar3[uVar20] >> 3] | (byte)(1 << ((byte)puVar3[uVar20] & 7));
        uVar20 = uVar20 + 1;
      } while ((uVar23 & 0x7fffffff) != uVar20);
      bVar16 = *__s & 0xfe;
    }
    *__s = bVar16;
    uVar17 = 0x1fff;
    local_68 = 0;
    uVar20 = 0;
    uVar15 = 0;
    do {
      if (__s[uVar15] != 0) {
        uVar17 = uVar17 & 0xffff;
        bVar26 = uVar15 < uVar17;
        if (bVar26) {
          uVar17 = uVar15 & 0xffffffff;
        }
        uVar10 = (uint)uVar20;
        if (bVar26) {
          uVar10 = (uint)local_68;
        }
        if ((ushort)uVar10 < uVar15) {
          local_68 = uVar15;
        }
        local_68 = local_68 & 0xffffffff;
        uVar20 = (ulong)uVar10;
        if ((ushort)uVar10 < uVar15) {
          uVar20 = uVar15 & 0xffffffff;
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != 0x2000);
    __s_00 = operator_new__(0x20000);
    uVar20 = 0;
    memset(__s_00,0,0x20000);
    sVar4 = 0;
    do {
      if ((uVar20 == 0) || ((__s[uVar20 >> 3 & 0x1fffffff] >> ((uint)uVar20 & 7) & 1) != 0)) {
        sVar14 = sVar4;
        sVar4 = sVar4 + 1;
      }
      else {
        sVar14 = 0;
      }
      *(short *)((long)__s_00 + uVar20 * 2) = sVar14;
      uVar20 = uVar20 + 1;
    } while (uVar20 != 0x10000);
    if (0 < (int)uVar23) {
      uVar20 = 0;
      do {
        puVar3[uVar20] = *(unsigned_short *)((long)__s_00 + (ulong)puVar3[uVar20] * 2);
        uVar20 = uVar20 + 1;
      } while ((uVar23 & 0x7fffffff) != uVar20);
    }
    pcVar19 = this->_outBuffer;
    *pcVar19 = (char)uVar17;
    pcVar19[1] = (char)(uVar17 >> 8);
    pcVar19[2] = (char)local_68;
    pcVar19[3] = (char)(local_68 >> 8);
    pcVar19 = pcVar19 + 4;
    if ((ushort)uVar17 <= (ushort)local_68) {
      iVar8 = ((uint)local_68 & 0xffff) - (int)(uVar17 & 0xffff);
      if (iVar8 != -1) {
        lVar24 = 0;
        do {
          pcVar19[lVar24] = __s[lVar24 + (uVar17 & 0xffff)];
          lVar24 = lVar24 + 1;
        } while (iVar8 + 1 != (int)lVar24);
        pcVar19 = pcVar19 + lVar24;
      }
    }
    iVar8 = this->_numChans;
    if (0 < iVar8) {
      lVar24 = 0;
      do {
        uVar23 = this->_channelData[lVar24].size;
        uVar20 = (ulong)uVar23;
        if (0 < (int)uVar23) {
          pCVar25 = this->_channelData + lVar24;
          lVar21 = 0;
          lVar22 = 0;
          do {
            wav2Encode((unsigned_short *)((long)pCVar25->start + lVar21),pCVar25->nx,(int)uVar20,
                       pCVar25->ny,pCVar25->nx * (int)uVar20,sVar4 - 1);
            lVar22 = lVar22 + 1;
            uVar20 = (ulong)pCVar25->size;
            lVar21 = lVar21 + 2;
          } while (lVar22 < (long)uVar20);
          iVar8 = this->_numChans;
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 < iVar8);
    }
    local_40[0] = '\0';
    local_40[1] = '\0';
    local_40[2] = '\0';
    local_40[3] = '\0';
    iVar8 = -(int)pcVar19;
    lVar24 = 0;
    compressed = pcVar19;
    do {
      *compressed = local_40[lVar24];
      compressed = compressed + 1;
      iVar8 = iVar8 + -1;
      lVar24 = lVar24 + 1;
    } while ((int)lVar24 != 4);
    local_3c = hufCompress(this->_tmpBuffer,
                           (int)((ulong)((long)puVar18 - (long)this->_tmpBuffer) >> 1),compressed);
    lVar24 = 0;
    do {
      pcVar19[lVar24] = *(char *)((long)&local_3c + lVar24);
      lVar24 = lVar24 + 1;
    } while ((int)lVar24 != 4);
    pcVar19 = this->_outBuffer;
    *local_38 = pcVar19;
    iVar8 = (local_3c - (int)pcVar19) - iVar8;
    operator_delete__(__s_00);
    operator_delete__(__s);
  }
  return iVar8;
}

Assistant:

int
PizCompressor::compress (const char *inPtr,
			 int inSize,
			 IMATH_NAMESPACE::Box2i range,
			 const char *&outPtr)
{
    //
    // This is the compress function which is used by both the tiled and
    // scanline compression routines.
    //

    //
    // Special case �- empty input buffer
    //

    if (inSize == 0)
    {
	outPtr = _outBuffer;
	return 0;
    }

    //
    // Rearrange the pixel data so that the wavelet
    // and Huffman encoders can process them easily.
    //
    // The wavelet and Huffman encoders both handle only
    // 16-bit data, so 32-bit data must be split into smaller
    // pieces.  We treat each 32-bit channel (UINT, FLOAT) as
    // two interleaved 16-bit channels.
    //

    int minX = range.min.x;
    int maxX = range.max.x;
    int minY = range.min.y;
    int maxY = range.max.y;
    
    if (maxY > _maxY)
        maxY = _maxY;
    
    if (maxX > _maxX)
        maxX = _maxX;

    unsigned short *tmpBufferEnd = _tmpBuffer;
    int i = 0;

    for (ChannelList::ConstIterator c = _channels.begin();
	 c != _channels.end();
	 ++c, ++i)
    {
	ChannelData &cd = _channelData[i];

	cd.start = tmpBufferEnd;
	cd.end = cd.start;

	cd.nx = numSamples (c.channel().xSampling, minX, maxX);
	cd.ny = numSamples (c.channel().ySampling, minY, maxY);
	cd.ys = c.channel().ySampling;

	cd.size = pixelTypeSize (c.channel().type) / pixelTypeSize (HALF);

	tmpBufferEnd += cd.nx * cd.ny * cd.size;
    }

    if (_format == XDR)
    {
	//
	// Machine-independent (Xdr) data format
	//

	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		if (modp (y, cd.ys) != 0)
		    continue;

		for (int x = cd.nx * cd.size; x > 0; --x)
		{
		    Xdr::read <CharPtrIO> (inPtr, *cd.end);
		    ++cd.end;
		}
	    }
	}
    }
    else
    {
	//
	// Native, machine-dependent data format
	//

	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		if (modp (y, cd.ys) != 0)
		    continue;

		int n = cd.nx * cd.size;
		memcpy (cd.end, inPtr, n * sizeof (unsigned short));
		inPtr  += n * sizeof (unsigned short);
		cd.end += n;
	    }
	}
    }

    #if defined (DEBUG)

	for (int i = 1; i < _numChans; ++i)
	    assert (_channelData[i-1].end == _channelData[i].start);

	assert (_channelData[_numChans-1].end == tmpBufferEnd);

    #endif

    //
    // Compress the range of the pixel data
    //

    AutoArray <unsigned char, BITMAP_SIZE> bitmap;
    unsigned short minNonZero;
    unsigned short maxNonZero;

    bitmapFromData (_tmpBuffer,
		    tmpBufferEnd - _tmpBuffer,
		    bitmap,
		    minNonZero, maxNonZero);

    AutoArray <unsigned short, USHORT_RANGE> lut;
    unsigned short maxValue = forwardLutFromBitmap (bitmap, lut);
    applyLut (lut, _tmpBuffer, tmpBufferEnd - _tmpBuffer);

    //
    // Store range compression info in _outBuffer
    //

    char *buf = _outBuffer;

    Xdr::write <CharPtrIO> (buf, minNonZero);
    Xdr::write <CharPtrIO> (buf, maxNonZero);

    if (minNonZero <= maxNonZero)
    {
	Xdr::write <CharPtrIO> (buf, (char *) &bitmap[0] + minNonZero,
				maxNonZero - minNonZero + 1);
    }

    //
    // Apply wavelet encoding
    //

    for (int i = 0; i < _numChans; ++i)
    {
	ChannelData &cd = _channelData[i];

	for (int j = 0; j < cd.size; ++j)
	{
	    wav2Encode (cd.start + j,
			cd.nx, cd.size,
			cd.ny, cd.nx * cd.size,
			maxValue);
	}
    }

    //
    // Apply Huffman encoding; append the result to _outBuffer
    //

    char *lengthPtr = buf;
    Xdr::write <CharPtrIO> (buf, int(0));

    int length = hufCompress (_tmpBuffer, tmpBufferEnd - _tmpBuffer, buf);
    Xdr::write <CharPtrIO> (lengthPtr, length);

    outPtr = _outBuffer;
    return buf - _outBuffer + length;
}